

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disassembler.cpp
# Opt level: O0

string * __thiscall
Disassembler::getLabel_abi_cxx11_(string *__return_storage_ptr__,Disassembler *this,int line)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  allocator local_19;
  int local_18;
  int local_14;
  int i;
  int line_local;
  
  local_14 = (int)this;
  local_18 = 0;
  _i = __return_storage_ptr__;
  while( true ) {
    uVar1 = (ulong)local_18;
    sVar2 = std::
            vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(&labels_abi_cxx11_);
    if (sVar2 <= uVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_19);
      std::allocator<char>::~allocator((allocator<char> *)&local_19);
      return __return_storage_ptr__;
    }
    pvVar3 = std::
             vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&labels_abi_cxx11_,(long)local_18);
    if (pvVar3->first == local_14 + 2) break;
    local_18 = local_18 + 1;
  }
  pvVar3 = std::
           vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&labels_abi_cxx11_,(long)local_18);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&pvVar3->second);
  return __return_storage_ptr__;
}

Assistant:

string Disassembler::getLabel(int line){
  for(int i = 0;i < labels.size();i++)
    if(labels[i].first == line+2) {// .globl e .text
      return labels[i].second;
    }
  return "";
}